

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaJsonWriter::WriteString(VmaJsonWriter *this,char *pStr)

{
  VmaJsonWriter *in_RSI;
  char *in_RDI;
  
  BeginString(in_RSI,in_RDI);
  EndString(in_RSI,in_RDI);
  return;
}

Assistant:

void VmaJsonWriter::WriteString(const char* pStr)
{
    BeginString(pStr);
    EndString();
}